

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall
absl::Flag<unsigned_int>::Flag
          (Flag<unsigned_int> *this,char *name,char *type,char *help,uint *default_value)

{
  allocator<char> *__a;
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined4 *in_R8;
  uint *in_stack_000000a8;
  FlagFunc *in_stack_ffffffffffffff08;
  FlagFunc *in_stack_ffffffffffffff10;
  string *this_00;
  string *name_00;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff28;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff30;
  shared_ptr<absl::internal::FlagFunc> local_98;
  allocator<char> local_81;
  string local_80 [56];
  string local_48 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  char *local_18;
  char *local_10;
  
  *in_RDI = &PTR__Flag_006f0318;
  *(undefined4 *)(in_RDI + 1) = *in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  __a = (allocator<char> *)operator_new(0x58);
  internal::FlagFunc::FlagFunc(in_stack_ffffffffffffff10);
  std::shared_ptr<absl::internal::FlagFunc>::shared_ptr<absl::internal::FlagFunc,void>
            ((shared_ptr<absl::internal::FlagFunc> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4036dd);
  peVar1->name = local_10;
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4036fc);
  peVar1->help = (char *)local_20;
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x40371c);
  peVar1->type = local_18;
  internal::anon_unknown_1::to_str<unsigned_int>(in_stack_000000a8);
  name_00 = (string *)(in_RDI + 2);
  peVar1 = std::
           __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x40374f);
  this_00 = local_48;
  std::__cxx11::string::operator=((string *)&peVar1->default_value,this_00);
  std::__cxx11::string::~string(this_00);
  std::__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x403789);
  std::function<void(std::__cxx11::string_const&)>::operator=
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_20,local_10,__a);
  std::shared_ptr<absl::internal::FlagFunc>::shared_ptr
            (&local_98,(shared_ptr<absl::internal::FlagFunc> *)in_stack_ffffffffffffff08);
  internal::RegisterFlag(name_00,(shared_ptr<absl::internal::FlagFunc> *)this_00);
  std::shared_ptr<absl::internal::FlagFunc>::~shared_ptr
            ((shared_ptr<absl::internal::FlagFunc> *)0x403802);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}